

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O0

void __thiscall absl::lts_20250127::Mutex::Unlock(Mutex *this)

{
  bool bVar1;
  bool local_91;
  char *absl_raw_log_internal_basename_1;
  bool should_try_cas_fast;
  bool should_try_cas;
  char *absl_raw_log_internal_basename;
  intptr_t v;
  Mutex *this_local;
  memory_order local_48;
  int local_44;
  memory_order __b;
  undefined1 local_31;
  ulong local_30;
  undefined4 local_28;
  undefined4 local_24;
  ulong local_20;
  char **local_18;
  Mutex *local_10;
  
  v = (intptr_t)this;
  DebugOnlyLockLeave(this);
  local_44 = 0;
  ___b = this;
  local_48 = std::operator&(memory_order_relaxed,__memory_order_mask);
  if (local_44 - 1U < 2) {
    this_local = (Mutex *)(this->mu_).super___atomic_base<long>._M_i;
  }
  else if (local_44 == 5) {
    this_local = (Mutex *)(this->mu_).super___atomic_base<long>._M_i;
  }
  else {
    this_local = (Mutex *)(this->mu_).super___atomic_base<long>._M_i;
  }
  absl_raw_log_internal_basename = (char *)this_local;
  if (((ulong)this_local & 9) == 8) {
    local_91 = ((ulong)this_local & 0x18) == 8 && ((ulong)this_local & 6) != 4;
    bVar1 = (((ulong)this_local ^ 10) & 0x1e) < 6;
    if (local_91 != bVar1) {
      raw_log_internal::RawLog
                (kFatal,"mutex.cc",0x6db,"internal logic error %llx %llx %llx\n",this_local,
                 (ulong)local_91,(ulong)bVar1);
      __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/synchronization/mutex.cc"
                    ,0x6db,"void absl::Mutex::Unlock()");
    }
    if (bVar1) {
      local_30 = (ulong)this_local & 0xffffffffffffffd7;
      local_18 = &absl_raw_log_internal_basename;
      local_24 = 3;
      local_28 = 0;
      LOCK();
      absl_raw_log_internal_basename = (char *)(this->mu_).super___atomic_base<long>._M_i;
      local_31 = this_local == (Mutex *)absl_raw_log_internal_basename;
      if ((bool)local_31) {
        (this->mu_).super___atomic_base<long>._M_i = local_30;
        absl_raw_log_internal_basename = (char *)this_local;
      }
      UNLOCK();
      local_20 = local_30;
      local_10 = this;
      if ((bool)local_31) {
        return;
      }
    }
    UnlockSlow(this,(SynchWaitParams *)0x0);
    return;
  }
  raw_log_internal::RawLog
            (kFatal,"mutex.cc",0x6b4,"Mutex unlocked when destroyed or not locked: v=0x%x",
             (ulong)this_local & 0xffffffff);
  __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/synchronization/mutex.cc"
                ,0x6b4,"void absl::Mutex::Unlock()");
}

Assistant:

void Mutex::Unlock() {
  ABSL_TSAN_MUTEX_PRE_UNLOCK(this, 0);
  DebugOnlyLockLeave(this);
  intptr_t v = mu_.load(std::memory_order_relaxed);

  if (kDebugMode && ((v & (kMuWriter | kMuReader)) != kMuWriter)) {
    ABSL_RAW_LOG(FATAL, "Mutex unlocked when destroyed or not locked: v=0x%x",
                 static_cast<unsigned>(v));
  }

  // should_try_cas is whether we'll try a compare-and-swap immediately.
  // NOTE: optimized out when kDebugMode is false.
  bool should_try_cas = ((v & (kMuEvent | kMuWriter)) == kMuWriter &&
                         (v & (kMuWait | kMuDesig)) != kMuWait);

  // But, we can use an alternate computation of it, that compilers
  // currently don't find on their own.  When that changes, this function
  // can be simplified.
  //
  // should_try_cas is true iff the bits satisfy the following conditions:
  //
  //                   Ev Wr Wa De
  // equal to           0  1
  // and not equal to         1  0
  //
  // after xoring by    0  1  0  1,  this is equivalent to:
  //
  // equal to           0  0
  // and not equal to         1  1,  which is the same as:
  //
  // smaller than       0  0  1  1
  static_assert(kMuEvent > kMuWait, "Needed for should_try_cas_fast");
  static_assert(kMuEvent > kMuDesig, "Needed for should_try_cas_fast");
  static_assert(kMuWriter > kMuWait, "Needed for should_try_cas_fast");
  static_assert(kMuWriter > kMuDesig, "Needed for should_try_cas_fast");

  bool should_try_cas_fast =
      ((v ^ (kMuWriter | kMuDesig)) &
       (kMuEvent | kMuWriter | kMuWait | kMuDesig)) < (kMuWait | kMuDesig);

  if (kDebugMode && should_try_cas != should_try_cas_fast) {
    // We would usually use PRIdPTR here, but is not correctly implemented
    // within the android toolchain.
    ABSL_RAW_LOG(FATAL, "internal logic error %llx %llx %llx\n",
                 static_cast<long long>(v),
                 static_cast<long long>(should_try_cas),
                 static_cast<long long>(should_try_cas_fast));
  }
  if (should_try_cas_fast &&
      mu_.compare_exchange_strong(v, v & ~(kMuWrWait | kMuWriter),
                                  std::memory_order_release,
                                  std::memory_order_relaxed)) {
    // fast writer release (writer with no waiters or with designated waker)
  } else {
    this->UnlockSlow(nullptr /*no waitp*/);  // take slow path
  }
  ABSL_TSAN_MUTEX_POST_UNLOCK(this, 0);
}